

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

OpResult __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::
SetEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
          (CordRepBtree *this,bool owned,CordRep *edge,size_t delta)

{
  size_t sVar1;
  size_t sVar2;
  iterator ppCVar3;
  OpResult OVar4;
  CordRep *r;
  iterator __end4;
  iterator __begin4;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> *local_70;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> *__range4;
  CordRepBtree *pCStack_60;
  int shift;
  undefined4 local_58;
  CordRepBtree *local_50;
  undefined4 local_48;
  char *local_40;
  size_t idx;
  size_t delta_local;
  CordRep *edge_local;
  CordRepBtree *pCStack_20;
  bool owned_local;
  CordRepBtree *this_local;
  OpResult result;
  
  idx = delta;
  delta_local = (size_t)edge;
  edge_local._7_1_ = owned;
  pCStack_20 = this;
  local_40 = index(this,(char *)0x0,(int)edge);
  if ((edge_local._7_1_ & 1) == 0) {
    pCStack_60 = CopyRaw(this,(this->super_CordRep).length);
    local_58 = 1;
    result.tree._0_4_ = 1;
    __range4._4_4_ = 1;
    this_local = pCStack_60;
    sVar1 = begin(this);
    sVar2 = back(this);
    ___begin4 = Edges(this,sVar1 + 1,sVar2 + 1);
    local_70 = (Span<absl::lts_20250127::cord_internal::CordRep_*const> *)&__begin4;
    __end4 = Span<absl::lts_20250127::cord_internal::CordRep_*const>::begin(local_70);
    ppCVar3 = Span<absl::lts_20250127::cord_internal::CordRep_*const>::end(local_70);
    for (; __end4 != ppCVar3; __end4 = __end4 + 1) {
      CordRep::Ref(*__end4);
    }
  }
  else {
    local_48 = 0;
    result.tree._0_4_ = 0;
    local_50 = this;
    this_local = this;
    CordRep::Unref(this->edges_[(long)local_40]);
  }
  this_local->edges_[(long)local_40] = (CordRep *)delta_local;
  (this_local->super_CordRep).length = (this_local->super_CordRep).length + idx;
  OVar4.action = result.tree._0_4_;
  OVar4.tree = this_local;
  OVar4._12_4_ = 0;
  return OVar4;
}

Assistant:

OpResult CordRepBtree::SetEdge(bool owned, CordRep* edge, size_t delta) {
  OpResult result;
  const size_t idx = index(edge_type);
  if (owned) {
    result = {this, kSelf};
    CordRep::Unref(edges_[idx]);
  } else {
    // Create a copy containing all unchanged edges. Unchanged edges are the
    // open interval [begin, back) or [begin + 1, end) depending on `edge_type`.
    // We conveniently cover both case using a constexpr `shift` being 0 or 1
    // as `end :== back + 1`.
    result = {CopyRaw(length), kCopied};
    constexpr int shift = edge_type == kFront ? 1 : 0;
    for (CordRep* r : Edges(begin() + shift, back() + shift)) {
      CordRep::Ref(r);
    }
  }
  result.tree->edges_[idx] = edge;
  result.tree->length += delta;
  return result;
}